

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall ShallowPrint::print(ShallowPrint *this,CourseComponent *root)

{
  ostream *poVar1;
  undefined8 *puVar2;
  char *local_68;
  long local_60;
  char local_58 [16];
  undefined8 *local_48;
  undefined8 *local_40;
  
  (*(root->super_Observer)._vptr_Observer[6])(&local_48);
  if (local_48 != local_40) {
    puVar2 = local_48;
    do {
      (**(code **)(*(long *)*puVar2 + 0x18))(&local_68);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_68,local_60);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," | ",3);
      if (local_68 != local_58) {
        operator_delete(local_68);
      }
      puVar2 = puVar2 + 1;
    } while (puVar2 != local_40);
  }
  if (local_48 != (undefined8 *)0x0) {
    operator_delete(local_48);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  return;
}

Assistant:

void print(CourseComponent* root) {
        for (auto course : root->getCourseVector()) {
            cout << course->getCourseName() << " | ";
        }
        cout << endl;
    }